

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lysp_qname_dup(ly_ctx *ctx,lysp_qname *orig_qname,lysp_qname *qname)

{
  LY_ERR LVar1;
  
  if (orig_qname->str == (char *)0x0) {
    LVar1 = LY_SUCCESS;
  }
  else {
    LVar1 = lydict_dup(ctx,orig_qname->str,&qname->str);
    if (orig_qname->mod == (lysp_module *)0x0) {
      __assert_fail("orig_qname->mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                    ,0x21b,
                    "LY_ERR lysp_qname_dup(const struct ly_ctx *, const struct lysp_qname *, struct lysp_qname *)"
                   );
    }
    qname->mod = orig_qname->mod;
  }
  return LVar1;
}

Assistant:

LY_ERR
lysp_qname_dup(const struct ly_ctx *ctx, const struct lysp_qname *orig_qname, struct lysp_qname *qname)
{
    LY_ERR ret = LY_SUCCESS;

    if (!orig_qname->str) {
        return LY_SUCCESS;
    }

    DUP_STRING(ctx, orig_qname->str, qname->str, ret);
    assert(orig_qname->mod);
    qname->mod = orig_qname->mod;

    return ret;
}